

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

void __thiscall
llvm::DWARFContext::DWARFContext
          (DWARFContext *this,
          unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_> *DObj,
          string *DWPName)

{
  string *DWPName_local;
  unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_> *DObj_local;
  DWARFContext *this_local;
  
  DIContext::DIContext(&this->super_DIContext,CK_DWARF);
  (this->super_DIContext)._vptr_DIContext = (_func_int **)&PTR__DWARFContext_030a36d0;
  DWARFUnitVector::DWARFUnitVector(&this->NormalUnits);
  std::unique_ptr<llvm::DWARFUnitIndex,std::default_delete<llvm::DWARFUnitIndex>>::
  unique_ptr<std::default_delete<llvm::DWARFUnitIndex>,void>
            ((unique_ptr<llvm::DWARFUnitIndex,std::default_delete<llvm::DWARFUnitIndex>> *)
             &this->CUIndex);
  std::unique_ptr<llvm::DWARFGdbIndex,std::default_delete<llvm::DWARFGdbIndex>>::
  unique_ptr<std::default_delete<llvm::DWARFGdbIndex>,void>
            ((unique_ptr<llvm::DWARFGdbIndex,std::default_delete<llvm::DWARFGdbIndex>> *)
             &this->GdbIndex);
  std::unique_ptr<llvm::DWARFUnitIndex,std::default_delete<llvm::DWARFUnitIndex>>::
  unique_ptr<std::default_delete<llvm::DWARFUnitIndex>,void>
            ((unique_ptr<llvm::DWARFUnitIndex,std::default_delete<llvm::DWARFUnitIndex>> *)
             &this->TUIndex);
  std::unique_ptr<llvm::DWARFDebugAbbrev,std::default_delete<llvm::DWARFDebugAbbrev>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugAbbrev>,void>
            ((unique_ptr<llvm::DWARFDebugAbbrev,std::default_delete<llvm::DWARFDebugAbbrev>> *)
             &this->Abbrev);
  std::unique_ptr<llvm::DWARFDebugLoc,std::default_delete<llvm::DWARFDebugLoc>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugLoc>,void>
            ((unique_ptr<llvm::DWARFDebugLoc,std::default_delete<llvm::DWARFDebugLoc>> *)&this->Loc)
  ;
  std::unique_ptr<llvm::DWARFDebugAranges,std::default_delete<llvm::DWARFDebugAranges>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugAranges>,void>
            ((unique_ptr<llvm::DWARFDebugAranges,std::default_delete<llvm::DWARFDebugAranges>> *)
             &this->Aranges);
  std::unique_ptr<llvm::DWARFDebugLine,std::default_delete<llvm::DWARFDebugLine>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugLine>,void>
            ((unique_ptr<llvm::DWARFDebugLine,std::default_delete<llvm::DWARFDebugLine>> *)
             &this->Line);
  std::unique_ptr<llvm::DWARFDebugFrame,std::default_delete<llvm::DWARFDebugFrame>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugFrame>,void>
            ((unique_ptr<llvm::DWARFDebugFrame,std::default_delete<llvm::DWARFDebugFrame>> *)
             &this->DebugFrame);
  std::unique_ptr<llvm::DWARFDebugFrame,std::default_delete<llvm::DWARFDebugFrame>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugFrame>,void>
            ((unique_ptr<llvm::DWARFDebugFrame,std::default_delete<llvm::DWARFDebugFrame>> *)
             &this->EHFrame);
  std::unique_ptr<llvm::DWARFDebugMacro,std::default_delete<llvm::DWARFDebugMacro>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugMacro>,void>
            ((unique_ptr<llvm::DWARFDebugMacro,std::default_delete<llvm::DWARFDebugMacro>> *)
             &this->Macro);
  std::unique_ptr<llvm::DWARFDebugNames,std::default_delete<llvm::DWARFDebugNames>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugNames>,void>
            ((unique_ptr<llvm::DWARFDebugNames,std::default_delete<llvm::DWARFDebugNames>> *)
             &this->Names);
  std::unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>::
  unique_ptr<std::default_delete<llvm::AppleAcceleratorTable>,void>
            ((unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>
              *)&this->AppleNames);
  std::unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>::
  unique_ptr<std::default_delete<llvm::AppleAcceleratorTable>,void>
            ((unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>
              *)&this->AppleTypes);
  std::unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>::
  unique_ptr<std::default_delete<llvm::AppleAcceleratorTable>,void>
            ((unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>
              *)&this->AppleNamespaces);
  std::unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>::
  unique_ptr<std::default_delete<llvm::AppleAcceleratorTable>,void>
            ((unique_ptr<llvm::AppleAcceleratorTable,std::default_delete<llvm::AppleAcceleratorTable>>
              *)&this->AppleObjC);
  DWARFUnitVector::DWARFUnitVector(&this->DWOUnits);
  std::unique_ptr<llvm::DWARFDebugAbbrev,std::default_delete<llvm::DWARFDebugAbbrev>>::
  unique_ptr<std::default_delete<llvm::DWARFDebugAbbrev>,void>
            ((unique_ptr<llvm::DWARFDebugAbbrev,std::default_delete<llvm::DWARFDebugAbbrev>> *)
             &this->AbbrevDWO);
  this->MaxVersion = 0;
  StringMap<std::weak_ptr<llvm::DWARFContext::DWOFile>,_llvm::MallocAllocator>::StringMap
            (&this->DWOFiles);
  std::weak_ptr<llvm::DWARFContext::DWOFile>::weak_ptr(&this->DWP);
  this->CheckedForDWP = false;
  std::__cxx11::string::string((string *)&this->DWPName,(string *)DWPName);
  std::unique_ptr<llvm::MCRegisterInfo,std::default_delete<llvm::MCRegisterInfo>>::
  unique_ptr<std::default_delete<llvm::MCRegisterInfo>,void>
            ((unique_ptr<llvm::MCRegisterInfo,std::default_delete<llvm::MCRegisterInfo>> *)
             &this->RegInfo);
  std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>::
  unique_ptr(&this->DObj,DObj);
  return;
}

Assistant:

DWARFContext::DWARFContext(std::unique_ptr<const DWARFObject> DObj,
                           std::string DWPName)
    : DIContext(CK_DWARF), DWPName(std::move(DWPName)), DObj(std::move(DObj)) {}